

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SrcListDelete(sqlite3 *db,SrcList *pList)

{
  Expr *p;
  ushort uVar1;
  int iVar2;
  anon_union_8_2_996c0f8d_for_u1 *paVar3;
  
  if (pList != (SrcList *)0x0) {
    paVar3 = &pList->a[0].u1;
    for (iVar2 = 0; iVar2 < pList->nSrc; iVar2 = iVar2 + 1) {
      if (paVar3[-10].zIndexedBy != (char *)0x0) {
        sqlite3DbNNFreeNN(db,paVar3[-10].zIndexedBy);
      }
      if (paVar3[-9].zIndexedBy != (char *)0x0) {
        sqlite3DbNNFreeNN(db,paVar3[-9].zIndexedBy);
      }
      if (paVar3[-8].zIndexedBy != (char *)0x0) {
        sqlite3DbNNFreeNN(db,paVar3[-8].zIndexedBy);
      }
      uVar1 = *(ushort *)((long)paVar3 + -0x1b);
      if ((uVar1 & 2) != 0) {
        sqlite3DbFree(db,paVar3->zIndexedBy);
        uVar1 = *(ushort *)((long)paVar3 + -0x1b);
      }
      if ((uVar1 & 4) != 0) {
        sqlite3ExprListDelete(db,paVar3->pFuncArg);
      }
      sqlite3DeleteTable(db,(Table *)paVar3[-7].pFuncArg);
      if ((Select *)paVar3[-6].pFuncArg != (Select *)0x0) {
        sqlite3SelectDelete(db,(Select *)paVar3[-6].pFuncArg);
      }
      p = ((anon_union_8_2_eeb63324_for_u3 *)(paVar3 + -2))->pOn;
      if (((ulong)paVar3->zIndexedBy & 0x4000000000000) == 0) {
        if (p != (Expr *)0x0) {
          sqlite3ExprDeleteNN(db,p);
        }
      }
      else {
        sqlite3IdListDelete(db,(IdList *)p);
      }
      paVar3 = paVar3 + 0xd;
    }
    sqlite3DbNNFreeNN(db,pList);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListDelete(sqlite3 *db, SrcList *pList){
  int i;
  SrcItem *pItem;
  assert( db!=0 );
  if( pList==0 ) return;
  for(pItem=pList->a, i=0; i<pList->nSrc; i++, pItem++){
    if( pItem->zDatabase ) sqlite3DbNNFreeNN(db, pItem->zDatabase);
    if( pItem->zName ) sqlite3DbNNFreeNN(db, pItem->zName);
    if( pItem->zAlias ) sqlite3DbNNFreeNN(db, pItem->zAlias);
    if( pItem->fg.isIndexedBy ) sqlite3DbFree(db, pItem->u1.zIndexedBy);
    if( pItem->fg.isTabFunc ) sqlite3ExprListDelete(db, pItem->u1.pFuncArg);
    sqlite3DeleteTable(db, pItem->pTab);
    if( pItem->pSelect ) sqlite3SelectDelete(db, pItem->pSelect);
    if( pItem->fg.isUsing ){
      sqlite3IdListDelete(db, pItem->u3.pUsing);
    }else if( pItem->u3.pOn ){
      sqlite3ExprDelete(db, pItem->u3.pOn);
    }
  }
  sqlite3DbNNFreeNN(db, pList);
}